

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

int Vec_WrdRemove(Vec_Wrd_t *p,word Entry)

{
  int iVar1;
  int local_24;
  int i;
  word Entry_local;
  Vec_Wrd_t *p_local;
  
  for (local_24 = 0; (local_24 < p->nSize && (p->pArray[local_24] != Entry));
      local_24 = local_24 + 1) {
  }
  if (local_24 == p->nSize) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = local_24;
    if (p->nSize <= local_24) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x334,"int Vec_WrdRemove(Vec_Wrd_t *, word)");
    }
    while (local_24 = iVar1 + 1, local_24 < p->nSize) {
      p->pArray[iVar1] = p->pArray[local_24];
      iVar1 = local_24;
    }
    p->nSize = p->nSize + -1;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Vec_WrdRemove( Vec_Wrd_t * p, word Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    if ( i == p->nSize )
        return 0;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
    return 1;
}